

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::sendMessage
          (CommonCore *this,InterfaceHandle sourceHandle,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  atomic<int> *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ushort uVar3;
  pointer pcVar4;
  _Alloc_hider __s2;
  size_type sVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar9;
  FederateState *this_00;
  string *psVar10;
  FunctionExecutionFailure *this_01;
  HelicsException *pHVar11;
  ActionMessage *command;
  char *pcVar12;
  pointer_____offset_0x10___ *ppuVar13;
  size_t sVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer ppVar15;
  pointer ppVar16;
  long lVar17;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view str;
  string_view fmt;
  format_args args;
  string_view message_05;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets_1;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  ActionMessage mess;
  string local_198;
  _Head_base<0UL,_helics::Message_*,_false> local_178;
  _Head_base<0UL,_helics::Message_*,_false> local_170;
  string local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  pointer pcStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  pointer local_128;
  long *local_120;
  long local_118;
  long local_110 [2];
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_100;
  ActionMessage local_e8;
  
  local_e8.source_handle.hid = sourceHandle.hid;
  if (sourceHandle.hid == -0x1aa152) {
    bVar7 = waitCoreRegistration(this);
    if (bVar7) {
      local_170._M_head_impl =
           (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
      ActionMessage::ActionMessage
                (&local_e8,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_170);
      if (local_170._M_head_impl != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_170,local_170._M_head_impl);
      }
      local_170._M_head_impl = (Message *)0x0;
      local_e8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
      BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
      goto LAB_0030ee43;
    }
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    message_00._M_str = "core is unable to register and has timed out, message was not sent";
    message_00._M_len = 0x42;
    FunctionExecutionFailure::FunctionExecutionFailure(this_01,message_00);
    ppuVar13 = &FunctionExecutionFailure::typeinfo;
    goto LAB_0030eef9;
  }
  puVar9 = getHandleInfo(this,sourceHandle);
  if (puVar9 == (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    pcVar12 = "handle is not valid";
    sVar14 = 0x13;
  }
  else {
    if (*(char *)((long)&puVar9[1]._M_t.
                         super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                         .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4) ==
        'e') {
      if (((ulong)puVar9[1]._M_t.
                  super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                  .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl &
          0x4000000000000000) != 0) {
        this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
        message_02._M_str =
             "Endpoint is receive only; no messages can be sent through this endpoint";
        message_02._M_len = 0x47;
        InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)this_01,message_02);
        ppuVar13 = &InvalidFunctionCall::typeinfo;
        goto LAB_0030eef9;
      }
      local_178._M_head_impl =
           (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      (message->_M_t).super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = (Message *)0x0;
      ActionMessage::ActionMessage
                (&local_e8,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_178);
      if (local_178._M_head_impl != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_178,local_178._M_head_impl);
      }
      local_178._M_head_impl = (Message *)0x0;
      str._M_str = (char *)puVar9[2]._M_t.
                           super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                           .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
      str._M_len = (size_t)puVar9[3]._M_t.
                           super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                           .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
      ActionMessage::setString(&local_e8,1,str);
      local_e8.source_id.gid =
           *(BaseType *)
            &(puVar9->_M_t).
             super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
             .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
      if (local_e8.messageID == 0) {
        LOCK();
        paVar1 = &this->messageCounter;
        local_e8.messageID = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        local_e8.messageID = local_e8.messageID + 1;
      }
      this_00 = getFederateAt(this,(LocalFederateId)
                                   *(BaseType *)
                                    &puVar9[1]._M_t.
                                     super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                                     .super__Head_base<0UL,_helics::BrokerObject_*,_false>.
                                     _M_head_impl);
      lVar17 = (this_00->allowed_send_time).internalTimeCode;
      if (local_e8.actionTime.internalTimeCode < lVar17) {
        local_e8.actionTime.internalTimeCode = lVar17;
      }
      iVar8 = FederateState::loggingLevel(this_00);
      if (0x11 < iVar8) {
        prettyPrintString_abi_cxx11_(&local_168,(helics *)&local_e8,command);
        local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p;
        pcStack_140 = (pointer)local_168._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0xf;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_148;
        ::fmt::v11::vformat_abi_cxx11_(&local_198,(v11 *)"send_message {}",fmt,args);
        message_05._M_str = local_198._M_dataplus._M_p;
        message_05._M_len = local_198._M_string_length;
        FederateState::logMessage
                  (this_00,0x12,(string_view)(ZEXT816(0x4482a2) << 0x40),message_05,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
      psVar10 = ActionMessage::getString_abi_cxx11_(&local_e8,0);
      uVar3 = *(ushort *)
               ((long)&puVar9[1]._M_t.
                       super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                       .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 6);
      if (psVar10->_M_string_length == 0) {
        if ((uVar3 >> 10 & 1) == 0) {
          pHVar11 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_03._M_str = "no destination specified in message";
          message_03._M_len = 0x23;
          HelicsException::HelicsException(pHVar11,message_03);
          *(undefined ***)pHVar11 = &PTR__HelicsException_005518c0;
          __cxa_throw(pHVar11,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        FederateState::getMessageDestinations
                  ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)&local_198,this_00,sourceHandle);
        if (local_198._M_dataplus._M_p != (pointer)local_198._M_string_length) {
          generateMessages(this,&local_e8,
                           (vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)&local_198);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_198._M_dataplus._M_p,
                          local_198.field_2._M_allocated_capacity - (long)local_198._M_dataplus._M_p
                         );
        }
        goto LAB_0030ee43;
      }
      if ((uVar3 >> 10 & 1) != 0) {
        FederateState::getMessageDestinations(&local_100,this_00,sourceHandle);
        ppVar16 = local_100.
                  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppVar15 = local_100.
                  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar10 = ActionMessage::getString_abi_cxx11_(&local_e8,0);
        local_120 = local_110;
        pcVar4 = (psVar10->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,pcVar4,pcVar4 + psVar10->_M_string_length);
        local_148 = &local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_120,local_118 + (long)local_120);
        uVar6 = local_138._M_allocated_capacity._0_4_;
        local_168._M_string_length = (size_type)pcStack_140;
        paVar2 = &local_198.field_2;
        if (local_148 == &local_138) {
          local_198.field_2._8_4_ = local_138._8_4_;
          local_198.field_2._12_4_ = local_138._12_4_;
          local_198._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_198._M_dataplus._M_p = (pointer)local_148;
        }
        local_198.field_2._M_allocated_capacity._4_4_ = local_138._M_allocated_capacity._4_4_;
        local_198.field_2._M_allocated_capacity._0_4_ = local_138._M_allocated_capacity._0_4_;
        local_198._M_string_length = (size_type)pcStack_140;
        pcStack_140 = (pointer)0x0;
        local_138._M_allocated_capacity._0_4_ = local_138._M_allocated_capacity._0_4_ & 0xffffff00;
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == paVar2) {
          local_168.field_2._M_allocated_capacity =
               CONCAT44(local_138._M_allocated_capacity._4_4_,uVar6);
          local_168.field_2._8_4_ = local_198.field_2._8_4_;
          local_168.field_2._12_4_ = local_198.field_2._12_4_;
        }
        else {
          local_168._M_dataplus._M_p = local_198._M_dataplus._M_p;
          local_168.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
        }
        local_198._M_dataplus._M_p = (pointer)paVar2;
        local_148 = &local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_168._M_dataplus._M_p,
                   local_168._M_dataplus._M_p + local_168._M_string_length);
        sVar5 = local_198._M_string_length;
        __s2._M_p = local_198._M_dataplus._M_p;
        local_128 = ppVar16;
        lVar17 = ((long)ppVar16 - (long)ppVar15 >> 3) * -0x5555555555555555 >> 2;
        ppVar16 = ppVar15;
        if (0 < lVar17) {
          ppVar16 = ppVar15 + lVar17 * 4;
          lVar17 = lVar17 + 1;
          ppVar15 = ppVar15 + 2;
          do {
            pcVar4 = (pointer)ppVar15[-2].second._M_len;
            if ((pcVar4 == (pointer)sVar5) &&
               ((pcVar4 == (pointer)0x0 ||
                (iVar8 = bcmp(ppVar15[-2].second._M_str,__s2._M_p,(size_t)pcVar4), iVar8 == 0)))) {
              ppVar15 = ppVar15 + -2;
              goto LAB_0030eda2;
            }
            pcVar4 = (pointer)ppVar15[-1].second._M_len;
            if ((pcVar4 == (pointer)sVar5) &&
               ((pcVar4 == (pointer)0x0 ||
                (iVar8 = bcmp(ppVar15[-1].second._M_str,__s2._M_p,(size_t)pcVar4), iVar8 == 0)))) {
              ppVar15 = ppVar15 + -1;
              goto LAB_0030eda2;
            }
            pcVar4 = (pointer)(ppVar15->second)._M_len;
            if ((pcVar4 == (pointer)sVar5) &&
               ((pcVar4 == (pointer)0x0 ||
                (iVar8 = bcmp((ppVar15->second)._M_str,__s2._M_p,(size_t)pcVar4), iVar8 == 0))))
            goto LAB_0030eda2;
            pcVar4 = (pointer)ppVar15[1].second._M_len;
            if ((pcVar4 == (pointer)sVar5) &&
               ((pcVar4 == (pointer)0x0 ||
                (iVar8 = bcmp(ppVar15[1].second._M_str,__s2._M_p,(size_t)pcVar4), iVar8 == 0)))) {
              ppVar15 = ppVar15 + 1;
              goto LAB_0030eda2;
            }
            lVar17 = lVar17 + -1;
            ppVar15 = ppVar15 + 4;
          } while (1 < lVar17);
        }
        lVar17 = ((long)local_128 - (long)ppVar16 >> 3) * -0x5555555555555555;
        if (lVar17 == 1) {
LAB_0030ed44:
          pcVar4 = (pointer)(ppVar16->second)._M_len;
          ppVar15 = local_128;
          if (((pcVar4 == (pointer)local_198._M_string_length) &&
              (ppVar15 = ppVar16, pcVar4 != (pointer)0x0)) &&
             (iVar8 = bcmp((ppVar16->second)._M_str,local_198._M_dataplus._M_p,(size_t)pcVar4),
             iVar8 != 0)) {
            ppVar15 = local_128;
          }
        }
        else if (lVar17 == 2) {
LAB_0030ed1c:
          pcVar4 = (pointer)(ppVar16->second)._M_len;
          if ((pcVar4 != (pointer)local_198._M_string_length) ||
             ((ppVar15 = ppVar16, pcVar4 != (pointer)0x0 &&
              (iVar8 = bcmp((ppVar16->second)._M_str,local_198._M_dataplus._M_p,(size_t)pcVar4),
              iVar8 != 0)))) {
            ppVar16 = ppVar16 + 1;
            goto LAB_0030ed44;
          }
        }
        else {
          ppVar15 = local_128;
          if ((lVar17 == 3) &&
             ((pcVar4 = (pointer)(ppVar16->second)._M_len,
              pcVar4 != (pointer)local_198._M_string_length ||
              ((ppVar15 = ppVar16, pcVar4 != (pointer)0x0 &&
               (iVar8 = bcmp((ppVar16->second)._M_str,local_198._M_dataplus._M_p,(size_t)pcVar4),
               iVar8 != 0)))))) {
            ppVar16 = ppVar16 + 1;
            goto LAB_0030ed1c;
          }
        }
LAB_0030eda2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148,
                          CONCAT44(local_138._M_allocated_capacity._4_4_,
                                   local_138._M_allocated_capacity._0_4_) + 1);
        }
        if (local_120 != local_110) {
          operator_delete(local_120,local_110[0] + 1);
        }
        if (ppVar15 ==
            local_100.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pHVar11 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_04._M_str = "targeted endpoint destination not in target list";
          message_04._M_len = 0x30;
          HelicsException::HelicsException(pHVar11,message_04);
          *(undefined ***)pHVar11 = &PTR__HelicsException_005518c0;
          __cxa_throw(pHVar11,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        if (local_100.
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.
                          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_100.
                                super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_100.
                                super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
LAB_0030ee43:
      ActionMessage::~ActionMessage(&local_e8);
      return;
    }
    this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
    pcVar12 = "handle does not point to an endpoint";
    sVar14 = 0x24;
  }
  message_01._M_str = pcVar12;
  message_01._M_len = sVar14;
  InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message_01);
  ppuVar13 = &InvalidIdentifier::typeinfo;
LAB_0030eef9:
  __cxa_throw(this_01,ppuVar13,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::sendMessage(InterfaceHandle sourceHandle, std::unique_ptr<Message> message)
{
    if (sourceHandle == gDirectSendHandle) {
        if (!waitCoreRegistration()) {
            throw(FunctionExecutionFailure(
                "core is unable to register and has timed out, message was not sent"));
        }
        ActionMessage mess(std::move(message));
        mess.source_id = global_id.load();
        mess.source_handle = sourceHandle;
        addActionMessage(std::move(mess));
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    if (checkActionFlag(*hndl, receive_only_flag)) {
        throw(InvalidFunctionCall(
            "Endpoint is receive only; no messages can be sent through this endpoint"));
    }
    ActionMessage mess(std::move(message));

    mess.setString(sourceStringLoc, hndl->key);
    mess.source_id = hndl->getFederateId();
    mess.source_handle = sourceHandle;
    if (mess.messageID == 0) {
        mess.messageID = ++messageCounter;
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto minTime = fed->nextAllowedSendTime();
    if (mess.actionTime < minTime) {
        mess.actionTime = minTime;
    }

    if (fed->loggingLevel() >= HELICS_LOG_LEVEL_DATA) {
        fed->logMessage(HELICS_LOG_LEVEL_DATA,
                        "",
                        fmt::format("send_message {}", prettyPrintString(mess)));
    }
    if (mess.getString(targetStringLoc).empty()) {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            if (targets.empty()) {
                return;
            }
            generateMessages(mess, targets);
        } else {
            throw(InvalidParameter("no destination specified in message"));
        }
    } else {
        if (checkActionFlag(*hndl, targeted_flag)) {
            auto targets = fed->getMessageDestinations(sourceHandle);
            auto res = std::find_if(targets.begin(),
                                    targets.end(),
                                    [destination = mess.getString(targetStringLoc)](
                                        const auto& val) { return (val.second == destination); });
            if (res == targets.end()) {
                throw(InvalidParameter("targeted endpoint destination not in target list"));
            }
        }
        addActionMessage(std::move(mess));
    }
}